

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int moveto_snode(lyxp_set *set,lys_node *cur_node,char *qname,uint16_t qname_len,int options)

{
  ly_ctx *last;
  int iVar1;
  char *pcVar2;
  lys_module *local_88;
  lyxp_node_type local_74;
  ly_ctx *plStack_70;
  lyxp_node_type root_type;
  ly_ctx *ctx;
  lys_node *sub;
  lys_module *moveto_mod;
  char *name_dict;
  char *ptr;
  int local_40;
  int temp_ctx;
  int idx;
  int pref_len;
  int orig_used;
  int i;
  int options_local;
  uint16_t qname_len_local;
  char *qname_local;
  lys_node *cur_node_local;
  lyxp_set *set_local;
  
  ptr._4_4_ = 0;
  moveto_mod = (lys_module *)0x0;
  if ((set == (lyxp_set *)0x0) || (set->type == LYXP_SET_EMPTY)) {
    set_local._4_4_ = 0;
  }
  else {
    orig_used = options;
    i._2_2_ = qname_len;
    _options_local = qname;
    qname_local = (char *)cur_node;
    cur_node_local = (lys_node *)set;
    if (set->type == LYXP_SET_SNODE_SET) {
      plStack_70 = cur_node->module->ctx;
      moveto_snode_get_root(cur_node,options,&local_74);
      name_dict = strnchr(_options_local,0x3a,(uint)i._2_2_);
      if (name_dict == (char *)0x0) {
        sub = (lys_node *)0x0;
      }
      else {
        temp_ctx = (int)name_dict - (int)_options_local;
        sub = (lys_node *)
              moveto_resolve_model
                        (_options_local,(uint16_t)temp_ctx,plStack_70,(lys_node *)qname_local,1);
        if ((lys_module *)sub == (lys_module *)0x0) {
          ly_vlog(LYE_XPATH_INMOD,LY_VLOG_NONE,(void *)0x0,(ulong)(uint)temp_ctx,_options_local);
          return -1;
        }
        _options_local = _options_local + (temp_ctx + 1);
        i._2_2_ = i._2_2_ - ((short)temp_ctx + 1);
      }
      moveto_mod = (lys_module *)lydict_insert(plStack_70,_options_local,(ulong)i._2_2_);
      idx = *(int *)&cur_node_local->ext;
      for (pref_len = 0; pref_len < idx; pref_len = pref_len + 1) {
        if (*(int *)(cur_node_local->ref + (long)pref_len * 0x10 + 0xc) == 1) {
          pcVar2 = cur_node_local->ref + (long)pref_len * 0x10 + 0xc;
          pcVar2[0] = '\0';
          pcVar2[1] = '\0';
          pcVar2[2] = '\0';
          pcVar2[3] = '\0';
          if ((*(int *)(cur_node_local->ref + (long)pref_len * 0x10 + 8) == 1) ||
             (*(int *)(cur_node_local->ref + (long)pref_len * 0x10 + 8) == 0)) {
            ctx = (ly_ctx *)0x0;
            while( true ) {
              last = ctx;
              if (sub == (lys_node *)0x0) {
                local_88 = lys_node_module(*(lys_node **)
                                            (cur_node_local->ref + (long)pref_len * 0x10));
              }
              else {
                local_88 = (lys_module *)sub;
              }
              ctx = (ly_ctx *)lys_getnext((lys_node *)last,(lys_node *)0x0,local_88,0);
              if (ctx == (ly_ctx *)0x0) break;
              iVar1 = moveto_snode_check((lys_node *)ctx,local_74,(char *)moveto_mod,
                                         (lys_module *)sub,orig_used);
              if (((iVar1 == 0) &&
                  (local_40 = set_snode_insert_node
                                        ((lyxp_set *)cur_node_local,(lys_node *)ctx,LYXP_NODE_ELEM),
                  local_40 < idx)) && (pref_len < local_40)) {
                pcVar2 = cur_node_local->ref + (long)local_40 * 0x10 + 0xc;
                pcVar2[0] = '\x02';
                pcVar2[1] = '\0';
                pcVar2[2] = '\0';
                pcVar2[3] = '\0';
                ptr._4_4_ = 1;
              }
            }
            ctx = (ly_ctx *)0x0;
          }
          else if ((*(uint *)(*(long *)(cur_node_local->ref + (long)pref_len * 0x10) + 0x38) &
                   0x802c) == 0) {
            ctx = (ly_ctx *)0x0;
            while (ctx = (ly_ctx *)
                         lys_getnext((lys_node *)ctx,
                                     *(lys_node **)(cur_node_local->ref + (long)pref_len * 0x10),
                                     (lys_module *)0x0,0), ctx != (ly_ctx *)0x0) {
              iVar1 = moveto_snode_check((lys_node *)ctx,local_74,(char *)moveto_mod,
                                         (lys_module *)sub,orig_used);
              if (((iVar1 == 0) &&
                  (local_40 = set_snode_insert_node
                                        ((lyxp_set *)cur_node_local,(lys_node *)ctx,LYXP_NODE_ELEM),
                  local_40 < idx)) && (pref_len < local_40)) {
                pcVar2 = cur_node_local->ref + (long)local_40 * 0x10 + 0xc;
                pcVar2[0] = '\x02';
                pcVar2[1] = '\0';
                pcVar2[2] = '\0';
                pcVar2[3] = '\0';
                ptr._4_4_ = 1;
              }
            }
            ctx = (ly_ctx *)0x0;
          }
        }
      }
      lydict_remove(plStack_70,(char *)moveto_mod);
      if (ptr._4_4_ != 0) {
        for (pref_len = 0; pref_len < idx; pref_len = pref_len + 1) {
          if (*(int *)(cur_node_local->ref + (long)pref_len * 0x10 + 0xc) == 2) {
            pcVar2 = cur_node_local->ref + (long)pref_len * 0x10 + 0xc;
            pcVar2[0] = '\x01';
            pcVar2[1] = '\0';
            pcVar2[2] = '\0';
            pcVar2[3] = '\0';
          }
        }
      }
      set_local._4_4_ = 0;
    }
    else {
      pcVar2 = print_set_type(set);
      ly_vlog(LYE_XPATH_INOP_1,LY_VLOG_NONE,(void *)0x0,"path operator",pcVar2);
      set_local._4_4_ = -1;
    }
  }
  return set_local._4_4_;
}

Assistant:

static int
moveto_snode(struct lyxp_set *set, struct lys_node *cur_node, const char *qname, uint16_t qname_len, int options)
{
    int i, orig_used, pref_len, idx, temp_ctx = 0;
    const char *ptr, *name_dict = NULL; /* optimalization - so we can do (==) instead (!strncmp(...)) in moveto_node_check() */
    struct lys_module *moveto_mod;
    const struct lys_node *sub;
    struct ly_ctx *ctx;
    enum lyxp_node_type root_type;

    if (!set || (set->type == LYXP_SET_EMPTY)) {
        return EXIT_SUCCESS;
    }

    if (set->type != LYXP_SET_SNODE_SET) {
        LOGVAL(LYE_XPATH_INOP_1, LY_VLOG_NONE, NULL, "path operator", print_set_type(set));
        return -1;
    }

    ctx = cur_node->module->ctx;
    moveto_snode_get_root(cur_node, options, &root_type);

    /* prefix */
    if ((ptr = strnchr(qname, ':', qname_len))) {
        pref_len = ptr - qname;
        moveto_mod = moveto_resolve_model(qname, pref_len, ctx, cur_node, 1);
        if (!moveto_mod) {
            LOGVAL(LYE_XPATH_INMOD, LY_VLOG_NONE, NULL, pref_len, qname);
            return -1;
        }
        qname += pref_len + 1;
        qname_len -= pref_len + 1;
    } else {
        moveto_mod = NULL;
    }

    /* name */
    name_dict = lydict_insert(ctx, qname, qname_len);

    orig_used = set->used;
    for (i = 0; i < orig_used; ++i) {
        if (set->val.snodes[i].in_ctx != 1) {
            continue;
        }
        set->val.snodes[i].in_ctx = 0;

        if ((set->val.snodes[i].type == LYXP_NODE_ROOT_CONFIG) || (set->val.snodes[i].type == LYXP_NODE_ROOT)) {
            /* it can actually be in any module, it's all <running>, but we know it's moveto_mod (if set),
             * so use it directly (root node itself is useless in this case) */
            sub = NULL;
            while ((sub = lys_getnext(sub, NULL, (moveto_mod ? moveto_mod : lys_node_module(set->val.snodes[i].snode)), 0))) {
                if (!moveto_snode_check(sub, root_type, name_dict, moveto_mod, options)) {
                    idx = set_snode_insert_node(set, sub, LYXP_NODE_ELEM);
                    /* we need to prevent these nodes to be considered in this moveto */
                    if ((idx < orig_used) && (idx > i)) {
                        set->val.snodes[idx].in_ctx = 2;
                        temp_ctx = 1;
                    }
                }
            }

        /* skip nodes without children - leaves, leaflists, and anyxmls (ouput root will eval to true) */
        } else if (!(set->val.snodes[i].snode->nodetype & (LYS_LEAF | LYS_LEAFLIST | LYS_ANYDATA))) {
            sub = NULL;
            while ((sub = lys_getnext(sub, set->val.snodes[i].snode, NULL, 0))) {
                if (!moveto_snode_check(sub, root_type, name_dict, moveto_mod, options)) {
                    idx = set_snode_insert_node(set, sub, LYXP_NODE_ELEM);
                    if ((idx < orig_used) && (idx > i)) {
                        set->val.snodes[idx].in_ctx = 2;
                        temp_ctx = 1;
                    }
                }
            }
        }
    }
    lydict_remove(ctx, name_dict);

    /* correct temporary in_ctx values */
    if (temp_ctx) {
        for (i = 0; i < orig_used; ++i) {
            if (set->val.snodes[i].in_ctx == 2) {
                set->val.snodes[i].in_ctx = 1;
            }
        }
    }

    return EXIT_SUCCESS;
}